

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  archive_string *as;
  char cVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  archive_read *a_00;
  char *pcVar5;
  int64_t iVar6;
  dev_t dVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  char *pcVar10;
  size_t min;
  int64_t remaining;
  gnu_sparse *sparse;
  archive_string_conv *paVar11;
  archive_acl *acl;
  int *piVar12;
  wchar_t *pwVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  void *pvVar17;
  size_t *in_R8;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong request;
  ulong uStack_60;
  ulong local_40;
  ssize_t bytes;
  
  uStack_60 = 1;
  do {
    tar_flush_unconsumed(a,unconsumed);
    pvVar17 = (void *)0x200;
    a_00 = (archive_read *)__archive_read_ahead(a,0x200,&bytes);
    if (bytes < 0) {
      uStack_60 = bytes & 0xffffffff;
      goto LAB_00425a08;
    }
    if (bytes == 0) goto LAB_00425a08;
    if ((ulong)bytes < 0x200) {
      pcVar5 = "Truncated tar archive";
      goto LAB_004259d2;
    }
    *unconsumed = 0x200;
    if (((char)(a_00->archive).magic != '\0') ||
       (wVar2 = archive_block_is_null((char *)a_00), wVar2 == L'\0')) {
      wVar2 = checksum(a_00,pvVar17);
      if (wVar2 == L'\0') {
        tar_flush_unconsumed(a,unconsumed);
        archive_set_error(&a->archive,0x16,"Damaged tar archive");
        uStack_60 = 0xfffffffffffffff6;
        goto LAB_00425a08;
      }
      iVar4 = tar->header_recursion_depth;
      tar->header_recursion_depth = iVar4 + 1;
      if (0x1f < iVar4) {
        tar_flush_unconsumed(a,unconsumed);
        pcVar5 = "Too many special headers";
        iVar4 = 0x16;
        goto LAB_004259b8;
      }
      cVar1 = *(char *)((long)&(a_00->archive).read_data_requested + 4);
      pcVar5 = "POSIX pax interchange format";
      if (cVar1 == 'x') {
        (a->archive).archive_format = 0x30002;
LAB_00425b84:
        (a->archive).archive_format_name = pcVar5;
        wVar2 = header_pax_extensions(a,tar,entry,a_00,unconsumed);
        goto LAB_00425ba0;
      }
      if (cVar1 == 'K') {
        wVar2 = read_body_to_string(a,(tar *)&tar->longlink,(archive_string *)a_00,unconsumed,in_R8)
        ;
        if (wVar2 == L'\0') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          if ((wVar2 != L'\0') && (uVar18 = (ulong)(uint)wVar2, wVar2 != L'\xffffffec'))
          goto LAB_00425d15;
          archive_entry_copy_link(entry,(tar->longlink).s);
          goto LAB_00425eb9;
        }
      }
      else if (cVar1 == 'L') {
        wVar2 = read_body_to_string(a,(tar *)&tar->longname,(archive_string *)a_00,unconsumed,in_R8)
        ;
        if (wVar2 == L'\0') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          uVar18 = (ulong)(uint)wVar2;
          if ((wVar2 != L'\0') && (wVar2 != L'\xffffffec')) goto LAB_00425d15;
          wVar2 = _archive_entry_copy_pathname_l
                            (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
          if (wVar2 != L'\0') {
            wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
            goto LAB_00425ba0;
          }
          goto LAB_00425d1f;
        }
      }
      else {
        if (cVar1 == 'V') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
LAB_00425ba0:
          uVar18 = (ulong)(uint)wVar2;
          goto LAB_00425d15;
        }
        if (cVar1 == 'X') {
          (a->archive).archive_format = 0x30002;
          pcVar5 = "POSIX pax interchange format (Sun variant)";
          goto LAB_00425b84;
        }
        if (cVar1 == 'g') {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          wVar2 = read_body_to_string(a,(tar *)&tar->pax_global,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 == L'\0') &&
             (wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 == L'\x01')) goto LAB_00425a08;
        }
        else {
          if (cVar1 != 'A') {
            if (*(long *)((long)&(a_00->client).dataset + 1) != 0x20207261747375) {
              iVar4 = bcmp((void *)((long)&(a_00->client).dataset + 1),"ustar",5);
              if (iVar4 != 0) {
                (a->archive).archive_format = 0x30000;
                (a->archive).archive_format_name = "tar (non-POSIX)";
                wVar2 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv);
                wVar3 = L'\0';
                if ((wVar2 != L'\0') &&
                   (wVar3 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                   wVar3 == L'\xffffffe2')) goto LAB_004259df;
                wVar2 = header_common(a,tar,entry,a_00);
                if (wVar3 < wVar2) {
                  wVar2 = wVar3;
                }
                uVar18 = (ulong)(uint)wVar2;
                tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
                goto LAB_00425d15;
              }
              if ((a->archive).archive_format != 0x30002) {
                (a->archive).archive_format = 0x30001;
                (a->archive).archive_format_name = "POSIX ustar format";
              }
              as = &tar->entry_pathname;
              cVar1 = *(char *)((long)&a_00->bidders[1].options + 1);
              (tar->entry_pathname).length = 0;
              if ((cVar1 != '\0') &&
                 (archive_strncat(as,(void *)((long)&a_00->bidders[1].options + 1),0x9b),
                 (tar->entry_pathname).s[(tar->entry_pathname).length - 1] != '/')) {
                archive_strappend_char(as,'/');
              }
              archive_strncat(as,a_00,100);
              wVar2 = _archive_entry_copy_pathname_l
                                (entry,(tar->entry_pathname).s,(tar->entry_pathname).length,
                                 tar->sconv);
              if (wVar2 == L'\0') {
                wVar2 = L'\0';
              }
              else {
                wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
                if (wVar2 == L'\xffffffe2') goto LAB_004259df;
              }
              wVar3 = header_common(a,tar,entry,a_00);
              if (wVar3 == L'\xffffffe2') goto LAB_004259df;
              if (wVar3 < wVar2) {
                wVar2 = wVar3;
              }
              wVar3 = _archive_entry_copy_uname_l
                                (entry,(char *)((long)&a_00->bidders[0].data + 1),0x20,tar->sconv);
              if (((wVar3 != L'\0') &&
                  (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 == L'\xffffffe2'
                  )) || ((wVar3 = _archive_entry_copy_gname_l
                                            (entry,(char *)((long)&a_00->bidders[0].options + 1),
                                             0x20,tar->sconv), wVar3 != L'\0' &&
                         (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                         wVar2 == L'\xffffffe2')))) goto LAB_004259df;
              if ((byte)(*(char *)((long)&(a_00->archive).read_data_requested + 4) - 0x33U) < 2) {
                dVar7 = tar_atol((char *)((long)&a_00->bidders[1].bid + 1),8);
                archive_entry_set_rdevmajor(entry,dVar7);
                dVar7 = tar_atol((char *)((long)&a_00->bidders[1].init + 1),8);
                archive_entry_set_rdevminor(entry,dVar7);
              }
              tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
              goto LAB_00426066;
            }
            (a->archive).archive_format = 0x30004;
            (a->archive).archive_format_name = "GNU tar format";
            wVar2 = header_common(a,tar,entry,a_00);
            if ((((wVar2 == L'\xffffffe2') ||
                 ((wVar3 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
                  wVar3 != L'\0' &&
                  (wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                  wVar2 == L'\xffffffe2')))) ||
                ((wVar3 = _archive_entry_copy_uname_l
                                    (entry,(char *)((long)&a_00->bidders[0].data + 1),0x20,
                                     tar->sconv), wVar3 != L'\0' &&
                 (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 == L'\xffffffe2')
                 ))) || ((wVar3 = _archive_entry_copy_gname_l
                                            (entry,(char *)((long)&a_00->bidders[0].options + 1),
                                             0x20,tar->sconv), wVar3 != L'\0' &&
                         (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                         wVar2 == L'\xffffffe2')))) goto LAB_004259df;
            if ((byte)(*(char *)((long)&(a_00->archive).read_data_requested + 4) - 0x33U) < 2) {
              dVar7 = tar_atol((char *)((long)&a_00->bidders[1].bid + 1),8);
              archive_entry_set_rdevmajor(entry,dVar7);
              dVar7 = tar_atol((char *)((long)&a_00->bidders[1].init + 1),8);
              archive_entry_set_rdevminor(entry,dVar7);
            }
            else {
              archive_entry_set_rdev(entry,0);
            }
            tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
            iVar6 = tar_atol((char *)((long)&a_00->bidders[1].options + 1),0xc);
            if (0 < iVar6) {
              archive_entry_set_atime(entry,iVar6,0);
            }
            iVar6 = tar_atol((char *)((long)&a_00->bidders[1].free + 5),0xc);
            if (0 < iVar6) {
              archive_entry_set_ctime(entry,iVar6,0);
            }
            if (*(char *)((long)&a_00->bidders[4].init + 3) != '\0') {
              iVar6 = tar_atol((char *)((long)&a_00->bidders[4].init + 3),0xc);
              tar->realsize = iVar6;
              archive_entry_set_size(entry,iVar6);
            }
            if (*(char *)((long)&a_00->bidders[2].init + 2) == '\0') {
              uVar18 = (ulong)(uint)wVar2;
              goto LAB_00425d1f;
            }
            wVar3 = gnu_sparse_old_parse
                              (a,tar,(gnu_sparse *)((long)&a_00->bidders[2].init + 2),L'\x04');
            if (wVar3 != L'\0') goto LAB_004259df;
            if (*(char *)((long)&a_00->bidders[4].init + 2) == '\0') goto LAB_00426066;
            goto LAB_00426428;
          }
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "Solaris tar";
          iVar6 = tar_atol((char *)((long)&(a_00->archive).read_data_offset + 4),0xc);
          wVar2 = read_body_to_string(a,tar,(archive_string *)a_00,unconsumed,in_R8);
          if ((wVar2 == L'\0') &&
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 == L'\0' ||
              (wVar2 == L'\xffffffec')))) {
            uVar18 = 0xffffffffffffffec;
            pcVar5 = (tar->acl_text).s;
            pcVar16 = pcVar5 + iVar6;
            lVar20 = 0;
            goto LAB_00425ad2;
          }
        }
      }
      uVar18 = (ulong)(uint)wVar2;
      goto LAB_00425d15;
    }
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format = 0x30000;
      (a->archive).archive_format_name = "tar";
    }
  } while (tar->read_concatenated_archives != 0);
  tar_flush_unconsumed(a,unconsumed);
  pcVar5 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (((pcVar5 != (char *)0x0) && (*pcVar5 == '\0')) &&
     (wVar2 = archive_block_is_null(pcVar5), wVar2 != L'\0')) {
    __archive_read_consume(a,0x200);
  }
  archive_clear_error(&a->archive);
  goto LAB_00425a08;
LAB_00426428:
  tar_flush_unconsumed(a,unconsumed);
  sparse = (gnu_sparse *)__archive_read_ahead(a,0x200,(ssize_t *)&local_40);
  if (-1 < (long)local_40) {
    if (local_40 < 0x200) {
      pcVar5 = "Truncated tar archive detected while reading sparse file data";
LAB_004259d2:
      iVar4 = 0x54;
      goto LAB_004259d4;
    }
    *unconsumed = 0x200;
    wVar3 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
    if (wVar3 == L'\0') goto code_r0x00426480;
  }
  goto LAB_004259df;
code_r0x00426480:
  if (sparse[0x15].offset[0] == '\0') goto code_r0x0042648a;
  goto LAB_00426428;
code_r0x0042648a:
  if (tar->sparse_list != (sparse_block *)0x0) {
    tar->entry_offset = tar->sparse_list->offset;
  }
LAB_00426066:
  uVar18 = (ulong)(uint)wVar2;
LAB_00425d15:
  if ((int)uVar18 != -0x1e) {
LAB_00425d1f:
    tar_flush_unconsumed(a,unconsumed);
    iVar4 = tar->header_recursion_depth + -1;
    tar->header_recursion_depth = iVar4;
    if (((int)uVar18 == 0) || ((int)uVar18 == -0x14)) goto LAB_004260e4;
    goto LAB_004261f3;
  }
LAB_004259df:
  uStack_60 = 0xffffffe2;
  goto LAB_00425a08;
LAB_00425ad2:
  cVar1 = *pcVar5;
  if ((cVar1 == '\0') || (pcVar16 <= pcVar5)) goto LAB_0042606e;
  if ((byte)(cVar1 - 0x38U) < 0xf8) {
    pcVar5 = "Malformed Solaris ACL attribute (invalid digit)";
    goto LAB_004260b8;
  }
  lVar20 = (ulong)(byte)(cVar1 - 0x30) + lVar20 * 8;
  if (0xffffff < lVar20) {
    pcVar5 = "Malformed Solaris ACL attribute (count too large)";
    goto LAB_004260b8;
  }
  pcVar5 = pcVar5 + 1;
  goto LAB_00425ad2;
LAB_0042606e:
  uVar15 = (uint)lVar20 & 0xfffc0000;
  if (uVar15 == 0x40000) {
    if (pcVar5 + 1 < pcVar16) {
      lVar20 = 1;
      do {
        lVar14 = lVar20;
        if (pcVar5[lVar14] == '\0') break;
        lVar20 = lVar14 + 1;
      } while (pcVar5 + lVar14 < pcVar16);
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar11 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar11;
        if (paVar11 != (archive_string_conv *)0x0) goto LAB_004264fb;
        goto LAB_004259df;
      }
LAB_004264fb:
      (tar->localname).length = 0;
      archive_strncat(&tar->localname,pcVar5 + 1,lVar14 - 1);
      acl = archive_entry_acl(entry);
      wVar2 = archive_acl_parse_l(acl,(tar->localname).s,L'Ā',tar->sconv_acl);
      if (wVar2 != L'\0') {
        uVar18 = (ulong)(uint)wVar2;
        piVar12 = __errno_location();
        if (*piVar12 == 0xc) {
          pcVar5 = "Can\'t allocate memory for ACL";
          iVar4 = 0xc;
        }
        else {
          pcVar5 = "Malformed Solaris ACL attribute (unparsable)";
          iVar4 = -1;
        }
        archive_set_error(&a->archive,iVar4,pcVar5);
        goto LAB_00425d15;
      }
LAB_00425eb9:
      uVar18 = 0;
    }
    else {
      pcVar5 = "Malformed Solaris ACL attribute (body overflow)";
LAB_004260b8:
      archive_set_error(&a->archive,-1,pcVar5);
    }
  }
  else if (uVar15 == 0xc0000) {
    archive_set_error(&a->archive,-1,"Solaris NFSv4 ACLs not supported");
  }
  else {
    archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)");
  }
  tar_flush_unconsumed(a,unconsumed);
  iVar4 = tar->header_recursion_depth + -1;
  tar->header_recursion_depth = iVar4;
LAB_004260e4:
  if ((iVar4 == 0) && (tar->process_mac_extensions != 0)) {
    pwVar8 = archive_entry_pathname_w(entry);
    pwVar13 = pwVar8;
    if (pwVar8 == (wchar_t *)0x0) {
      pcVar5 = archive_entry_pathname(entry);
      pcVar16 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        wVar2 = L'\xffffffe7';
      }
      else {
        do {
          while( true ) {
            pcVar10 = pcVar5 + 1;
            cVar1 = *pcVar5;
            pcVar5 = pcVar10;
            if (cVar1 != '/') break;
            if (*pcVar10 != '\0') {
              pcVar16 = pcVar10;
            }
          }
        } while (cVar1 != '\0');
        wVar2 = L'\0';
        if (((*pcVar16 == '.') && (pcVar16[1] == '_')) && (pcVar16[2] != '\0')) goto LAB_00426187;
      }
    }
    else {
      do {
        while( true ) {
          pwVar9 = pwVar8 + 1;
          wVar2 = *pwVar8;
          pwVar8 = pwVar9;
          if (wVar2 != L'/') break;
          if (*pwVar9 != L'\0') {
            pwVar13 = pwVar9;
          }
        }
      } while (wVar2 != L'\0');
      wVar2 = L'\0';
      if (((*pwVar13 == L'.') && (pwVar13[1] == L'_')) && (pwVar13[2] != L'\0')) {
LAB_00426187:
        min = archive_entry_size(entry);
        pvVar17 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar17 == (void *)0x0) {
          *unconsumed = 0;
          wVar2 = L'\xffffffe2';
        }
        else {
          archive_entry_copy_mac_metadata(entry,pvVar17,min);
          *unconsumed = min + 0x1ff & 0xfffffffffffffe00;
          tar_flush_unconsumed(a,unconsumed);
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
        }
      }
    }
    wVar3 = (wchar_t)uVar18;
    uVar18 = uVar18 & 0xffffffff;
    if (wVar2 < wVar3) {
      uVar18 = (ulong)(uint)wVar2;
    }
  }
LAB_004261f3:
  iVar4 = (int)uVar18;
  if (iVar4 != -0x14) {
    if (iVar4 == 1) {
      pcVar5 = "Damaged tar archive";
      iVar4 = 0x16;
LAB_004259d4:
      archive_set_error(&a->archive,iVar4,pcVar5);
      goto LAB_004259df;
    }
    uStack_60 = 0xffffffe2;
    if (iVar4 != 0) goto LAB_00425a08;
  }
  uVar19 = uVar18;
  if (tar->sparse_gnu_pending != '\0') {
    if ((tar->sparse_gnu_major != 1) || (tar->sparse_gnu_minor != 0)) {
      pcVar5 = "Unrecognized GNU sparse file format";
      iVar4 = -1;
LAB_004259b8:
      archive_set_error(&a->archive,iVar4,pcVar5);
      uStack_60 = 0xffffffffffffffec;
      goto LAB_00425a08;
    }
    tar->sparse_gnu_pending = '\0';
    gnu_clear_sparse_list(tar);
    local_40 = tar->entry_bytes_remaining;
    iVar6 = gnu_sparse_10_atol(a,tar,(int64_t *)&local_40,unconsumed);
    uStack_60 = 0xffffffffffffffe2;
    if (-1 < (int)iVar6) {
      iVar4 = (int)iVar6 + 1;
      do {
        iVar4 = iVar4 + -1;
        if (iVar4 < 1) {
          tar_flush_unconsumed(a,unconsumed);
          lVar20 = tar->entry_bytes_remaining - local_40;
          request = (ulong)(-(int)lVar20 & 0x1ff);
          uVar18 = __archive_read_consume(a,request);
          uStack_60 = 0xffffffffffffffe2;
          if (request == uVar18) {
            uStack_60 = lVar20 + request;
          }
          break;
        }
        iVar6 = gnu_sparse_10_atol(a,tar,(int64_t *)&local_40,unconsumed);
        if ((iVar6 < 0) ||
           (remaining = gnu_sparse_10_atol(a,tar,(int64_t *)&local_40,unconsumed), remaining < 0)) {
          uVar19 = uVar18 & 0xffffffff;
          break;
        }
        wVar2 = gnu_add_sparse_entry(a,tar,iVar6,remaining);
        uVar19 = uVar18 & 0xffffffff;
      } while (wVar2 == L'\0');
    }
    tar->entry_bytes_remaining = tar->entry_bytes_remaining - uStack_60;
    if ((long)uStack_60 < 0) goto LAB_00425a08;
    tar->sparse_gnu_pending = '\0';
  }
  uStack_60 = uVar19 & 0xffffffff;
LAB_00425a08:
  return (wchar_t)uStack_60;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				tar->entry_bytes_remaining -= bytes_read;
				if (bytes_read < 0)
					return ((int)bytes_read);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}